

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

void pnga_access_ghost_element(Integer g_a,AccessIndex *index,Integer *subscript,Integer *ld)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer IVar6;
  ulong uVar7;
  Integer IVar8;
  int iVar9;
  long lVar10;
  C_Integer CVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  int _ndim;
  ulong uVar16;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer tmp_sub [7];
  int local_118 [10];
  long local_f0;
  long local_e8 [8];
  long local_a8 [7];
  long alStack_70 [8];
  
  lVar1 = g_a + 1000;
  IVar6 = pnga_nodeid();
  pgVar5 = GA;
  local_f0 = lVar1;
  uVar2 = GA[lVar1].ndim;
  uVar16 = (ulong)(short)uVar2;
  if (0 < (long)uVar16) {
    uVar7 = 0;
    do {
      alStack_70[uVar7 + 1] = subscript[uVar7] + -1;
      uVar7 = uVar7 + 1;
    } while (uVar16 != uVar7);
  }
  iVar9 = GA[lVar1].distr_type;
  if (iVar9 - 1U < 3) {
    uVar7 = (long)(int)IVar6 % GA[lVar1].num_blocks[0];
    local_118[0] = (int)uVar7;
    if (1 < (short)uVar2) {
      uVar7 = uVar7 & 0xffffffff;
      lVar14 = 0;
      IVar8 = IVar6;
      do {
        IVar8 = (long)((int)IVar8 - (int)uVar7) / GA[g_a + 1000].num_blocks[lVar14];
        uVar7 = (long)(int)IVar8 % GA[g_a + 1000].num_blocks[lVar14 + 1];
        local_118[lVar14 + 1] = (int)uVar7;
        lVar14 = lVar14 + 1;
      } while ((uVar16 & 0xffffffff) - 1 != lVar14);
    }
    if (0 < (short)uVar2) {
      lVar14 = 0;
      do {
        iVar9 = *(int *)((long)local_118 + lVar14);
        lVar10 = *(long *)((long)GA[g_a + 1000].block_dims + lVar14 * 2);
        *(long *)((long)local_a8 + lVar14 * 2) = lVar10 * iVar9 + 1;
        lVar10 = ((long)iVar9 + 1) * lVar10;
        *(long *)((long)local_e8 + lVar14 * 2) = lVar10;
        lVar12 = *(long *)((long)GA[g_a + 1000].dims + lVar14 * 2);
        if (lVar12 <= lVar10) {
          lVar10 = lVar12;
        }
        *(long *)((long)local_e8 + lVar14 * 2) = lVar10;
        lVar14 = lVar14 + 4;
      } while ((uVar16 & 0xffffffff) << 2 != lVar14);
    }
    goto LAB_00179963;
  }
  if (iVar9 == 4) {
    uVar7 = (long)(int)IVar6 % GA[lVar1].num_blocks[0];
    local_118[0] = (int)uVar7;
    if (1 < (short)uVar2) {
      uVar7 = uVar7 & 0xffffffff;
      lVar14 = 0;
      IVar8 = IVar6;
      do {
        IVar8 = (long)((int)IVar8 - (int)uVar7) / GA[g_a + 1000].num_blocks[lVar14];
        uVar7 = (long)(int)IVar8 % GA[g_a + 1000].num_blocks[lVar14 + 1];
        local_118[lVar14 + 1] = (int)uVar7;
        lVar14 = lVar14 + 1;
      } while ((uVar16 & 0xffffffff) - 1 != lVar14);
    }
    if (0 < (short)uVar2) {
      pCVar4 = GA[lVar1].mapc;
      lVar14 = 0;
      iVar9 = 0;
      do {
        iVar3 = *(int *)((long)local_118 + lVar14);
        lVar10 = (long)iVar9 + (long)iVar3;
        *(C_Integer *)((long)local_a8 + lVar14 * 2) = pCVar4[lVar10];
        if ((long)iVar3 < *(long *)((long)GA[lVar1].num_blocks + lVar14 * 2) + -1) {
          lVar10 = GA[lVar1].mapc[lVar10 + 1] + -1;
        }
        else {
          lVar10 = *(long *)((long)GA[lVar1].dims + lVar14 * 2);
        }
        *(long *)((long)local_e8 + lVar14 * 2) = lVar10;
        iVar9 = iVar9 + *(int *)((long)GA[lVar1].num_blocks + lVar14 * 2);
        lVar14 = lVar14 + 4;
      } while ((uVar16 & 0xffffffff) << 2 != lVar14);
    }
    goto LAB_00179963;
  }
  if (iVar9 != 0) goto LAB_00179963;
  if (GA[lVar1].num_rstrctd == 0) {
    if ((short)uVar2 < 1) {
      lVar14 = 1;
    }
    else {
      lVar14 = 1;
      uVar7 = 0;
      do {
        lVar14 = lVar14 * GA[g_a + 1000].nblock[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar16 != uVar7);
    }
    if ((-1 < IVar6) && (IVar6 < lVar14)) {
      if (0 < (short)uVar2) {
        pCVar4 = GA[lVar1].mapc;
        lVar14 = 0;
        uVar7 = 0;
        IVar8 = IVar6;
        do {
          lVar12 = (long)GA[g_a + 1000].nblock[uVar7];
          lVar10 = IVar8 % lVar12;
          local_a8[uVar7] = pCVar4[lVar10 + lVar14];
          if (lVar10 == lVar12 + -1) {
            CVar11 = GA[g_a + 1000].dims[uVar7];
          }
          else {
            CVar11 = pCVar4[lVar10 + lVar14 + 1] + -1;
          }
          lVar14 = lVar14 + lVar12;
          local_e8[uVar7] = CVar11;
          uVar7 = uVar7 + 1;
          IVar8 = IVar8 / lVar12;
        } while (uVar16 != uVar7);
      }
      goto LAB_00179963;
    }
LAB_00179929:
    if ((short)uVar2 < 1) goto LAB_00179963;
    memset(local_a8,0,uVar16 << 3);
  }
  else {
    if (IVar6 < GA[lVar1].num_rstrctd) {
      if ((short)uVar2 < 1) {
        lVar14 = 1;
      }
      else {
        lVar14 = 1;
        uVar7 = 0;
        do {
          lVar14 = lVar14 * GA[g_a + 1000].nblock[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar16 != uVar7);
      }
      if ((-1 < IVar6) && (IVar6 < lVar14)) {
        if (0 < (short)uVar2) {
          pCVar4 = GA[lVar1].mapc;
          lVar14 = 0;
          uVar7 = 0;
          IVar8 = IVar6;
          do {
            lVar12 = (long)GA[g_a + 1000].nblock[uVar7];
            lVar10 = IVar8 % lVar12;
            local_a8[uVar7] = pCVar4[lVar10 + lVar14];
            if (lVar10 == lVar12 + -1) {
              CVar11 = GA[g_a + 1000].dims[uVar7];
            }
            else {
              CVar11 = pCVar4[lVar10 + lVar14 + 1] + -1;
            }
            lVar14 = lVar14 + lVar12;
            local_e8[uVar7] = CVar11;
            uVar7 = uVar7 + 1;
            IVar8 = IVar8 / lVar12;
          } while (uVar16 != uVar7);
        }
        goto LAB_00179963;
      }
      goto LAB_00179929;
    }
    if ((short)uVar2 < 1) goto LAB_00179963;
    memset(local_a8,0,(ulong)uVar2 << 3);
  }
  memset(local_e8,0xff,uVar16 << 3);
LAB_00179963:
  if (uVar16 == 1) {
    *ld = (local_e8[0] - local_a8[0]) + pgVar5[lVar1].width[0] * 2 + 1;
  }
  if ((short)uVar2 < 2) {
    lVar10 = 1;
    lVar14 = 0;
  }
  else {
    lVar10 = 1;
    lVar12 = 0;
    lVar14 = 0;
    do {
      lVar14 = lVar14 + alStack_70[lVar12 + 1] * lVar10;
      lVar13 = (local_e8[lVar12] - local_a8[lVar12]) + pgVar5[g_a + 1000].width[lVar12] * 2 + 1;
      ld[lVar12] = lVar13;
      lVar10 = lVar10 * lVar13;
      lVar12 = lVar12 + 1;
    } while (uVar16 - 1 != lVar12);
  }
  uVar7 = (ulong)pgVar5[lVar1].elemsize;
  pcVar15 = pgVar5[lVar1].ptr[IVar6] + (lVar10 * alStack_70[uVar16] + lVar14) * uVar7;
  IVar6 = pnga_type_c2f((long)pgVar5[lVar1].type);
  if (IVar6 - 0x3f2U < 6) {
    if ((0x3dU >> ((uint)(IVar6 - 0x3f2U) & 0x1f) & 1) == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = **(ulong **)(BYTE_ARRAY_001d5729 + IVar6 * 8 + 0x2e7);
      *index = (long)((long)pcVar15 - uVar16) >> ("group >= 0"[IVar6 * 8 + 3] & 0x3fU);
    }
  }
  else {
    uVar16 = 0;
  }
  if ((ulong)pcVar15 % uVar7 != uVar16 % uVar7) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,pcVar15,(ulong)pcVar15 % uVar7,
           uVar16,uVar16 % uVar7);
    pnga_error("nga_access: MA addressing problem: base address misallignment",local_f0);
  }
  *index = *index + 1;
  return;
}

Assistant:

void pnga_access_ghost_element(Integer g_a, AccessIndex* index,
                        Integer subscript[], Integer ld[])
{
char *ptr=NULL;
Integer  handle = GA_OFFSET + g_a;
Integer i=0;
Integer tmp_sub[MAXDIM];
unsigned long    elemsize=0;
unsigned long    lref=0, lptr=0;
Integer me = pnga_nodeid();
   /* Indices conform to Fortran convention. Shift them down 1 so that
      gam_LocationWithGhosts works. */
   for (i=0; i<GA[handle].ndim; i++) tmp_sub[i] = subscript[i] - 1;
   gam_LocationWithGhosts(me, handle, tmp_sub, &ptr, ld);
   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;

   FLUSH_CACHE;
}